

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O3

_Bool NewtFileExists(char *path)

{
  FILE *__stream;
  
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool NewtFileExists(char * path)
{
    FILE *  f;
    
    f = fopen(path, "r");
    
    if (f != NULL)
    {
        fclose(f);
        return true;
    }
    
    return false;
}